

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

void create_secret_door(level *lev,mkroom *croom,xchar walls)

{
  int iVar1;
  uint uVar2;
  char y;
  int iVar3;
  char x;
  bool bVar4;
  
  iVar3 = 100;
LAB_0023a17d:
  do {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      impossible("couldn\'t create secret door on any walls 0x%x",(ulong)(uint)(int)walls);
      return;
    }
    iVar1 = rn2(((int)croom->hx - (int)croom->lx) + 1);
    x = (char)iVar1 + croom->lx;
    iVar1 = rn2(((int)croom->hy - (int)croom->ly) + 1);
    y = (char)iVar1 + croom->ly;
    uVar2 = mt_random();
    switch(uVar2 & 3) {
    case 0:
      if ((walls & 1U) == 0) goto LAB_0023a17d;
      y = croom->ly + -1;
      break;
    case 1:
      if ((walls & 2U) == 0) goto LAB_0023a17d;
      y = croom->hy + '\x01';
      break;
    case 2:
      if ((walls & 4U) == 0) goto LAB_0023a17d;
      x = croom->lx + -1;
      break;
    case 3:
      if ((walls & 8U) == 0) goto LAB_0023a17d;
      x = croom->hx + '\x01';
    }
    iVar1 = okdoor(lev,x,y);
    if (iVar1 != 0) {
      lev->locations[x][y].typ = '\x0f';
      *(uint *)&lev->locations[x][y].field_0x6 =
           *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f | 0x40;
      add_door(lev,(int)x,(int)y,croom);
      return;
    }
  } while( true );
}

Assistant:

void create_secret_door(struct level *lev,
			struct mkroom *croom,
			xchar walls) /* any of W_NORTH | W_SOUTH | W_EAST | W_WEST
					(or W_ANY) */
{
    xchar sx, sy; /* location of the secret door */
    int count;

    for (count = 0; count < 100; count++) {
	sx = rn1(croom->hx - croom->lx + 1, croom->lx);
	sy = rn1(croom->hy - croom->ly + 1, croom->ly);

	switch(rn2(4)) {
	case 0:  /* top */
	    if (!(walls & W_NORTH)) continue;
	    sy = croom->ly-1; break;
	case 1: /* bottom */
	    if (!(walls & W_SOUTH)) continue;
	    sy = croom->hy+1; break;
	case 2: /* left */
	    if (!(walls & W_EAST)) continue;
	    sx = croom->lx-1; break;
	case 3: /* right */
	    if (!(walls & W_WEST)) continue;
	    sx = croom->hx+1; break;
	}

	if (okdoor(lev, sx, sy)) {
	    lev->locations[sx][sy].typ = SDOOR;
	    lev->locations[sx][sy].doormask = D_CLOSED;
	    add_door(lev, sx, sy, croom);
	    return;
	}
    }

    impossible("couldn't create secret door on any walls 0x%x", walls);
}